

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_modelNotEqualByUnits_Test::TestBody(Equality_modelNotEqualByUnits_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ModelPtr m2;
  ModelPtr m1;
  UnitsPtr u2;
  UnitsPtr u1;
  long *local_90;
  AssertHelper local_88 [8];
  AssertionResult local_80;
  long local_70 [2];
  byte local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  shared_ptr *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  shared_ptr *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Model::create();
  local_80._0_8_ = (shared_ptr *)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"unitsA","");
  libcellml::Units::create(local_20);
  if ((shared_ptr *)local_80._0_8_ != (shared_ptr *)local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  local_80._0_8_ = (shared_ptr *)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"unitsB","");
  libcellml::Units::create(local_30);
  if ((shared_ptr *)local_80._0_8_ != (shared_ptr *)local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  libcellml::Model::addUnits(local_40);
  libcellml::Model::addUnits(local_50);
  local_80._0_8_ = local_50;
  local_80.message_.ptr_ = local_48;
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_48->_M_string_length = (int)local_48->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_48->_M_string_length = (int)local_48->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_40);
  local_60[0] = bVar1 ^ 1;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_80.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 != 0) goto LAB_00121400;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.message_.ptr_);
    if ((local_60[0] & 1) == 0) {
LAB_00121400:
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_80,(char *)local_60,"m1->equals(m2)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x38e,(char *)local_80._0_8_);
      testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(local_88);
      if ((shared_ptr *)local_80._0_8_ != (shared_ptr *)local_70) {
        operator_delete((void *)local_80._0_8_,local_70[0] + 1);
      }
      if (((local_90 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80._0_8_ = local_40;
  local_80.message_.ptr_ = local_38;
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_50);
  local_60[0] = bVar1 ^ 1;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_80.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 == 0) goto LAB_001215c6;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.message_.ptr_);
    if ((local_60[0] & 1) != 0) goto LAB_001215c6;
  }
  testing::Message::Message((Message *)&local_90);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_80,(char *)local_60,"m2->equals(m1)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x38f,(char *)local_80._0_8_);
  testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
  testing::internal::AssertHelper::~AssertHelper(local_88);
  if ((shared_ptr *)local_80._0_8_ != (shared_ptr *)local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  if (((local_90 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_90 != (long *)0x0)) {
    (**(code **)(*local_90 + 8))();
  }
LAB_001215c6:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return;
}

Assistant:

TEST(Equality, modelNotEqualByUnits)
{
    libcellml::ModelPtr m1 = libcellml::Model::create();
    libcellml::ModelPtr m2 = libcellml::Model::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsB");

    m1->addUnits(u1);
    m2->addUnits(u2);

    EXPECT_FALSE(m1->equals(m2));
    EXPECT_FALSE(m2->equals(m1));
}